

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

ActionResultHolder<std::experimental::fundamentals_v1::optional<InotifyEvent>_> *
testing::internal::ActionResultHolder<std::experimental::fundamentals_v1::optional<InotifyEvent>>::
PerformAction<std::experimental::fundamentals_v1::optional<InotifyEvent>()>
          (Action<std::experimental::fundamentals_v1::optional<InotifyEvent>_()> *action,
          ArgumentTuple *args)

{
  ActionResultHolder<std::experimental::fundamentals_v1::optional<InotifyEvent>_> *this;
  _Optional_base<InotifyEvent,_true> _Stack_78;
  _Optional_base<InotifyEvent,_true> local_48;
  
  this = (ActionResultHolder<std::experimental::fundamentals_v1::optional<InotifyEvent>_> *)
         operator_new(0x38);
  Action<std::experimental::fundamentals_v1::optional<InotifyEvent>_()>::Perform
            ((Result *)&_Stack_78,action,args);
  std::experimental::fundamentals_v1::_Optional_base<InotifyEvent,_true>::_Optional_base
            (&local_48,&_Stack_78);
  ActionResultHolder<std::experimental::fundamentals_v1::optional<InotifyEvent>_>::
  ActionResultHolder(this,(Wrapper *)&local_48);
  std::experimental::fundamentals_v1::_Optional_base<InotifyEvent,_true>::~_Optional_base(&local_48)
  ;
  std::experimental::fundamentals_v1::_Optional_base<InotifyEvent,_true>::~_Optional_base
            (&_Stack_78);
  return this;
}

Assistant:

static ActionResultHolder*
  PerformAction(const Action<F>& action,
                const typename Function<F>::ArgumentTuple& args) {
    return new ActionResultHolder(Wrapper(action.Perform(args)));
  }